

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kqueue.c
# Opt level: O0

uint get_fd_used(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int our_errno;
  uint used;
  uint i;
  uint fd_max;
  undefined4 local_c;
  undefined4 local_8;
  
  uVar2 = get_fd_limit();
  local_c = 0;
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  for (local_8 = 0; local_8 < uVar2; local_8 = local_8 + 1) {
    iVar3 = fcntl(local_8,1);
    if (iVar3 == 0) {
      local_c = local_c + 1;
    }
  }
  piVar4 = __errno_location();
  *piVar4 = iVar1;
  return local_c;
}

Assistant:

unsigned int
get_fd_used(void)
{
    unsigned int fd_max = get_fd_limit();
    unsigned int i;
    unsigned int used = 0;
    int our_errno = errno; /* Preserve errno */

#ifdef __linux__
    for (i = 0; i < fd_max; i++) {
        if (fcntl(i, F_GETFD) == 0)
            used++;
    }
#endif

    errno = our_errno;

    return used;
}